

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmFunctionCall(LlvmCompilationContext *ctx,ExprFunctionCall *node)

{
  ExprBase *value;
  LLVMValueRef value_00;
  TypeBase *argumentType;
  IntrusiveList<ExprBase> *pIVar1;
  TypeFunction *functionType;
  SmallArray<LLVMValueRefOpaque_*,_32U> arguments;
  undefined1 local_150 [8];
  undefined1 local_148 [16];
  LLVMValueRefOpaque *local_138 [32];
  Allocator *local_38;
  
  argumentType = (TypeBase *)node->function;
  functionType = (TypeFunction *)(argumentType->name).end;
  if ((functionType == (TypeFunction *)0x0) || ((functionType->super_TypeBase).typeID != 0x15)) {
    functionType = (TypeFunction *)0x0;
  }
  CompileLlvm(ctx,(ExprBase *)argumentType);
  local_38 = ctx->allocator;
  local_148._0_8_ = local_138;
  local_148._8_8_ = (char *)0x2000000000;
  pIVar1 = &node->arguments;
  while (value = pIVar1->head, value != (ExprBase *)0x0) {
    local_150 = (undefined1  [8])CompileArgument(ctx,argumentType,value);
    argumentType = (TypeBase *)local_150;
    SmallArray<LLVMValueRefOpaque_*,_32U>::push_back
              ((SmallArray<LLVMValueRefOpaque_*,_32U> *)local_148,(LLVMValueRefOpaque **)local_150);
    pIVar1 = (IntrusiveList<ExprBase> *)&value->next;
  }
  local_150 = (undefined1  [8])&placeholderValue;
  SmallArray<LLVMValueRefOpaque_*,_32U>::push_back
            ((SmallArray<LLVMValueRefOpaque_*,_32U> *)local_148,(LLVMValueRefOpaque **)local_150);
  CompileLlvmFunctionType(ctx,functionType);
  value_00 = ConvertToStackType(ctx,(LLVMValueRef)&placeholderValue,(node->super_ExprBase).type);
  CheckType(ctx,&node->super_ExprBase,value_00);
  SmallArray<LLVMValueRefOpaque_*,_32U>::~SmallArray
            ((SmallArray<LLVMValueRefOpaque_*,_32U> *)local_148);
  return value_00;
}

Assistant:

LLVMValueRef CompileLlvmFunctionCall(LlvmCompilationContext &ctx, ExprFunctionCall *node)
{
	TypeFunction *typeFunction = getType<TypeFunction>(node->function->type);

	LLVMValueRef function = CompileLlvm(ctx, node->function);

	SmallArray<LLVMValueRef, 32> arguments(ctx.allocator);

	bool isStructReturnType = IsStructReturnType(typeFunction->returnType);
	LLVMValueRef resultStorage = NULL;

	if(isStructReturnType)
	{
		resultStorage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, typeFunction->returnType), "call_return_storage");

		arguments.push_back(resultStorage);
	}

	TypeHandle *argumentType = typeFunction->arguments.head;

	for(ExprBase *value = node->arguments.head; value; value = value->next)
	{
		arguments.push_back(CompileArgument(ctx, argumentType->type, value));

		argumentType = argumentType->next;
	}

	arguments.push_back(LLVMBuildExtractValue(ctx.builder, function, 0, "context"));

	LLVMValueRef functionRef = LLVMBuildExtractValue(ctx.builder, function, 1, "function");

	LLVMTypeRef functionType = LLVMPointerType(CompileLlvmFunctionType(ctx, typeFunction), 0);

	functionRef = LLVMBuildPointerCast(ctx.builder, functionRef, functionType, "to_func_type");

	LLVMValueRef result = LLVMBuildCall(ctx.builder, functionRef, arguments.data, arguments.count, "");

	if(isStructReturnType)
	{
		LLVMAddCallSiteAttribute(result, 1, LLVMCreateEnumAttribute(ctx.context, LLVMGetEnumAttributeKindForName("sret", unsigned(strlen("sret"))), 0));

		result = LLVMBuildLoad(ctx.builder, resultStorage, "");
	}

	return CheckType(ctx, node, ConvertToStackType(ctx, result, node->type));
}